

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

size_t hd_available(hd_context *ctx,hd_stream *stm,size_t max)

{
  hd_error_stack_slot *phVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  
  sVar5 = (long)stm->wp - (long)stm->rp;
  if (sVar5 != 0) {
    return sVar5;
  }
  iVar3 = hd_push_try(ctx);
  iVar4 = -1;
  if (iVar3 != 0) {
    iVar3 = __sigsetjmp(ctx->error->top->buffer,0);
    if (iVar3 == 0) {
      iVar4 = (*stm->next)(ctx,stm,1);
    }
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (1 < phVar1->code) {
    hd_rethrow_if(ctx,4);
    hd_warn(ctx,"read error; treating as end of file");
    stm->error = 1;
    iVar4 = -1;
  }
  if (iVar4 == -1) {
    stm->eof = 1;
    sVar5 = 0;
  }
  else {
    puVar2 = stm->rp;
    stm->rp = puVar2 + -1;
    sVar5 = (long)stm->wp - (long)(puVar2 + -1);
  }
  return sVar5;
}

Assistant:

static inline size_t hd_available(hd_context *ctx, hd_stream *stm, size_t max)
{
    size_t len = stm->wp - stm->rp;
    int c = EOF;

    if (len)
        return len;
    hd_try(ctx)
    {
        c = stm->next(ctx, stm, max);
    }
    hd_catch(ctx)
    {
        hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
        hd_warn(ctx, "read error; treating as end of file");
        stm->error = 1;
        c = EOF;
    }
    if (c == EOF)
    {
        stm->eof = 1;
        return 0;
    }
    stm->rp--;
    return stm->wp - stm->rp;
}